

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JwtStrategy.cpp
# Opt level: O3

optional<Vault::AuthenticationResponse> * __thiscall
Vault::JwtStrategy::authenticate
          (optional<Vault::AuthenticationResponse> *__return_storage_ptr__,JwtStrategy *this,
          Client *client)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  Path local_90;
  Url local_70;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  local_b0 = &local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"/login","");
  paVar1 = &local_90.value_.field_2;
  if (local_b0 == &local_a0) {
    local_90.value_.field_2._8_8_ = local_a0._8_8_;
    local_90.value_._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_90.value_._M_dataplus._M_p = (pointer)local_b0;
  }
  local_90.value_.field_2._M_allocated_capacity._1_7_ = local_a0._M_allocated_capacity._1_7_;
  local_90.value_.field_2._M_local_buf[0] = local_a0._M_local_buf[0];
  local_90.value_._M_string_length = local_a8;
  local_a8 = 0;
  local_a0._M_local_buf[0] = '\0';
  local_b0 = &local_a0;
  getUrl(&local_70,this,client,&local_90);
  local_50._8_8_ = 0;
  local_38 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/abedra[P]libvault/src/auth/strategies/JwtStrategy.cpp:6:84)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/abedra[P]libvault/src/auth/strategies/JwtStrategy.cpp:6:84)>
             ::_M_manager;
  local_50._M_unused._M_object = this;
  HttpConsumer::authenticate(__return_storage_ptr__,client,&local_70,(NoArgJsonProducer *)&local_50)
  ;
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.value_._M_dataplus._M_p != &local_70.value_.field_2) {
    operator_delete(local_70.value_._M_dataplus._M_p,
                    local_70.value_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.value_._M_dataplus._M_p != paVar1) {
    operator_delete(local_90.value_._M_dataplus._M_p,
                    local_90.value_.field_2._M_allocated_capacity + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,CONCAT71(local_a0._M_allocated_capacity._1_7_,local_a0._M_local_buf[0])
                             + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<Vault::AuthenticationResponse>
Vault::JwtStrategy::authenticate(const Vault::Client &client) {
  return HttpConsumer::authenticate(client, getUrl(client, Vault::Path{"/login"}), [this]() {
    nlohmann::json j;
    j = nlohmann::json::object();
    j["role"] = role_.value();
    j["jwt"] = jwt_.value();
    return j.dump();
  });
}